

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

cl_int clCommandFillImageKHR
                 (cl_command_buffer_khr command_buffer,cl_command_queue command_queue,
                 cl_command_properties_khr *properties,cl_mem image,void *fill_color,size_t *origin,
                 size_t *region,cl_uint num_sync_points_in_wait_list,
                 cl_sync_point_khr *sync_point_wait_list,cl_sync_point_khr *sync_point,
                 cl_mutable_command_khr *mutable_handle)

{
  uint64_t enqueueCounter;
  CLIntercept *pIntercept;
  cl_command_buffer_khr cmdbuf;
  byte bVar1;
  cl_int errorCode;
  CLdispatchX *pCVar2;
  time_point end;
  allocator local_99;
  time_point local_98;
  uint64_t local_90;
  cl_command_buffer_khr local_88;
  string local_80;
  void *local_60;
  size_t *local_58;
  string syncPointWaitList;
  
  pIntercept = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x472;
  }
  local_88 = command_buffer;
  local_60 = fill_color;
  local_58 = origin;
  pCVar2 = CLIntercept::dispatchX(g_pIntercept,command_buffer);
  if (pCVar2->clCommandFillImageKHR ==
      (_func_cl_int_cl_command_buffer_khr_cl_command_queue_cl_command_properties_khr_ptr_cl_mem_void_ptr_size_t_ptr_size_t_ptr_cl_uint_cl_sync_point_khr_ptr_cl_sync_point_khr_ptr_cl_mutable_command_khr_ptr
       *)0x0) {
    return -0x472;
  }
  enqueueCounter = (pIntercept->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  getFormattedSyncPointWaitList_abi_cxx11_
            (&syncPointWaitList,pIntercept,num_sync_points_in_wait_list,sync_point_wait_list);
  if ((pIntercept->m_Config).CallLogging == true) {
    CLIntercept::callLoggingEnter
              (pIntercept,"clCommandFillImageKHR",enqueueCounter,(cl_kernel)0x0,
               "command_buffer = %p, command_queue = %p, image = %p%s",local_88,command_queue,image,
               syncPointWaitList._M_dataplus._M_p);
  }
  local_90 = enqueueCounter;
  if (((pIntercept->m_Config).HostPerformanceTiming == false) &&
     ((pIntercept->m_Config).ChromeCallLogging != true)) {
    local_98.__d.__r = (duration)0;
  }
  else {
    local_98.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  cmdbuf = local_88;
  errorCode = (*pCVar2->clCommandFillImageKHR)
                        (local_88,command_queue,properties,image,local_60,local_58,region,
                         num_sync_points_in_wait_list,sync_point_wait_list,sync_point,mutable_handle
                        );
  if (((pIntercept->m_Config).HostPerformanceTiming == false) &&
     ((pIntercept->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((pIntercept->m_Config).HostPerformanceTiming == true) &&
       (((pIntercept->m_Config).HostPerformanceTimingMinEnqueue <= local_90 &&
        (local_90 <= (pIntercept->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      std::__cxx11::string::string((string *)&local_80,"",&local_99);
      CLIntercept::updateHostTimingStats(pIntercept,"clCommandFillImageKHR",&local_80,local_98,end);
      std::__cxx11::string::~string((string *)&local_80);
    }
  }
  if ((pIntercept->m_Config).ErrorLogging == false) {
    bVar1 = (pIntercept->m_Config).ErrorAssert;
    if ((bool)bVar1 == false) {
      if ((errorCode == 0) || ((pIntercept->m_Config).NoErrors == false)) goto LAB_0013b1bf;
    }
    else if (errorCode == 0) goto LAB_0013b194;
  }
  else {
    if (errorCode == 0) {
LAB_0013b194:
      errorCode = 0;
      goto LAB_0013b1bf;
    }
    CLIntercept::logError(pIntercept,"clCommandFillImageKHR",errorCode);
    bVar1 = (pIntercept->m_Config).ErrorAssert;
  }
  if ((bVar1 & 1) != 0) {
    raise(5);
  }
  if ((pIntercept->m_Config).NoErrors != false) {
    errorCode = 0;
  }
LAB_0013b1bf:
  if (((cmdbuf != (cl_command_buffer_khr)0x0) && (errorCode == 0)) &&
     ((pIntercept->m_Config).DumpCommandBuffers == true)) {
    std::__cxx11::string::string((string *)&local_80,"",&local_99);
    CLIntercept::recordCommandBufferCommand
              (pIntercept,cmdbuf,"clCommandFillImageKHR",&local_80,num_sync_points_in_wait_list,
               sync_point_wait_list,sync_point);
    std::__cxx11::string::~string((string *)&local_80);
  }
  if ((pIntercept->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (pIntercept,"clCommandFillImageKHR",errorCode,(cl_event *)0x0,sync_point);
  }
  if ((pIntercept->m_Config).ChromeCallLogging == true) {
    std::__cxx11::string::string((string *)&local_80,"",&local_99);
    CLIntercept::chromeCallLoggingExit
              (pIntercept,"clCommandFillImageKHR",&local_80,true,local_90,local_98,end);
    std::__cxx11::string::~string((string *)&local_80);
  }
  if ((mutable_handle != (cl_mutable_command_khr *)0x0) &&
     (*mutable_handle != (cl_mutable_command_khr)0x0)) {
    CLIntercept::addMutableCommandInfo(pIntercept,*mutable_handle,cmdbuf,0);
  }
  std::__cxx11::string::~string((string *)&syncPointWaitList);
  return errorCode;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clCommandFillImageKHR(
    cl_command_buffer_khr command_buffer,
    cl_command_queue command_queue,
    const cl_command_properties_khr* properties,
    cl_mem image,
    const void* fill_color,
    const size_t* origin,
    const size_t* region,
    cl_uint num_sync_points_in_wait_list,
    const cl_sync_point_khr* sync_point_wait_list,
    cl_sync_point_khr* sync_point,
    cl_mutable_command_khr* mutable_handle)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(command_buffer);
        if( dispatchX.clCommandFillImageKHR )
        {
            GET_ENQUEUE_COUNTER();

            const std::string syncPointWaitList = getFormattedSyncPointWaitList(
                pIntercept,
                num_sync_points_in_wait_list,
                sync_point_wait_list);

            CALL_LOGGING_ENTER(
                "command_buffer = %p, command_queue = %p, image = %p%s",
                command_buffer,
                command_queue,
                image,
                syncPointWaitList.c_str() );
            HOST_PERFORMANCE_TIMING_START();

            cl_int  retVal = dispatchX.clCommandFillImageKHR(
                command_buffer,
                command_queue,
                properties,
                image,
                fill_color,
                origin,
                region,
                num_sync_points_in_wait_list,
                sync_point_wait_list,
                sync_point,
                mutable_handle );

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( retVal );
            RECORD_COMMAND_BUFFER_COMMAND(
                retVal,
                command_buffer,
                num_sync_points_in_wait_list,
                sync_point_wait_list,
                sync_point );
            CALL_LOGGING_EXIT_SYNC_POINT( retVal, sync_point );
            ADD_MUTABLE_COMMAND( mutable_handle, command_buffer );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_BUFFER_KHR);
}